

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O1

void __thiscall
tchecker::zg::local_extra_lu_plus_t::extrapolate
          (local_extra_lu_plus_t *this,db_t *dbm,clock_id_t dim,vloc_t *vloc)

{
  clock_id_t cVar1;
  
  cVar1 = clockbounds::local_lu_map_t::clock_number
                    ((this->super_local_lu_extrapolation_t)._clock_bounds.
                     super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (cVar1 + 1 == dim) {
    clockbounds::local_lu_map_t::bounds
              ((this->super_local_lu_extrapolation_t)._clock_bounds.
               super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,vloc,(this->super_local_lu_extrapolation_t)._l,
               (this->super_local_lu_extrapolation_t)._u);
    tchecker::dbm::extra_lu_plus
              (dbm,dim,(integer_t *)&((this->super_local_lu_extrapolation_t)._l)->_fam,
               (integer_t *)&((this->super_local_lu_extrapolation_t)._u)->_fam);
    return;
  }
  __assert_fail("dim == _clock_bounds->clock_number() + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/extrapolation.cc"
                ,0x78,
                "virtual void tchecker::zg::local_extra_lu_plus_t::extrapolate(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::vloc_t &)"
               );
}

Assistant:

void local_extra_lu_plus_t::extrapolate(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::vloc_t const & vloc)
{
  assert(dim == _clock_bounds->clock_number() + 1);
  _clock_bounds->bounds(vloc, *_l, *_u);
  tchecker::dbm::extra_lu_plus(dbm, dim, _l->ptr(), _u->ptr());
}